

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O2

void TTD::NSSnapObjects::EmitAddtlInfo_SnapArrayInfoCore<double>
               (SnapArrayInfo<double> *arrayInfo,FileWriter *writer)

{
  SnapArrayInfoBlock<double> *pSVar1;
  uint32 uVar2;
  SnapArrayInfoBlock<double> **ppSVar3;
  SnapArrayInfoBlock<double> **ppSVar4;
  uint uVar5;
  
  FileWriter::WriteLengthValue(writer,arrayInfo->Length,CommaSeparator);
  uVar2 = 0;
  ppSVar3 = &arrayInfo->Data;
  for (ppSVar4 = ppSVar3; *ppSVar4 != (SnapArrayInfoBlock<double> *)0x0; ppSVar4 = &(*ppSVar4)->Next
      ) {
    uVar2 = uVar2 + 1;
  }
  FileWriter::WriteLengthValue(writer,uVar2,CommaAndBigSpaceSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  (*writer->_vptr_FileWriter[8])(writer,1);
  ppSVar4 = ppSVar3;
  while (pSVar1 = *ppSVar4, pSVar1 != (SnapArrayInfoBlock<double> *)0x0) {
    (*writer->_vptr_FileWriter[6])(writer,(ulong)(pSVar1 == *ppSVar3 ^ 3));
    FileWriter::WriteUInt32(writer,index,pSVar1->FirstIndex,NoSeparator);
    FileWriter::WriteUInt32(writer,offset,pSVar1->LastIndex,CommaSeparator);
    FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
    for (uVar2 = pSVar1->FirstIndex; uVar2 < pSVar1->LastIndex; uVar2 = uVar2 + 1) {
      uVar5 = uVar2 - pSVar1->FirstIndex;
      (*writer->_vptr_FileWriter[6])(writer,(ulong)(uVar5 != 0));
      FileWriter::WriteInt32(writer,isValid,(uint)pSVar1->ArrayValidTags[uVar5],NoSeparator);
      if (pSVar1->ArrayValidTags[uVar5] != '\0') {
        SnapArrayInfo_EmitValue(pSVar1->ArrayRangeContents[uVar5],writer);
      }
      (*writer->_vptr_FileWriter[7])(writer);
    }
    (*writer->_vptr_FileWriter[5])(writer,0);
    (*writer->_vptr_FileWriter[7])(writer,0);
    ppSVar4 = &pSVar1->Next;
  }
  (*writer->_vptr_FileWriter[8])(writer,0xffffffffffffffff);
  (*writer->_vptr_FileWriter[5])(writer,2);
  return;
}

Assistant:

void EmitAddtlInfo_SnapArrayInfoCore(SnapArrayInfo<T>* arrayInfo, FileWriter* writer)
        {
            writer->WriteLengthValue(arrayInfo->Length, NSTokens::Separator::CommaSeparator);

            uint32 blockCount = 0;
            for(SnapArrayInfoBlock<T>* currInfo = arrayInfo->Data; currInfo != nullptr; currInfo = currInfo->Next)
            {
                blockCount++;
            }

            writer->WriteLengthValue(blockCount, NSTokens::Separator::CommaAndBigSpaceSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            writer->AdjustIndent(1);
            for(SnapArrayInfoBlock<T>* currInfo = arrayInfo->Data; currInfo != nullptr; currInfo = currInfo->Next)
            {
                writer->WriteRecordStart(currInfo == arrayInfo->Data ? NSTokens::Separator::BigSpaceSeparator : NSTokens::Separator::CommaAndBigSpaceSeparator);
                writer->WriteUInt32(NSTokens::Key::index, currInfo->FirstIndex);
                writer->WriteUInt32(NSTokens::Key::offset, currInfo->LastIndex, NSTokens::Separator::CommaSeparator);

                writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
                for(uint32 i = currInfo->FirstIndex; i < currInfo->LastIndex; ++i)
                {
                    uint32 j = (i - currInfo->FirstIndex);
                    writer->WriteRecordStart(j == 0 ? NSTokens::Separator::NoSeparator : NSTokens::Separator::CommaSeparator);

                    writer->WriteInt32(NSTokens::Key::isValid, currInfo->ArrayValidTags[j]);
                    if(currInfo->ArrayValidTags[j])
                    {
                        SnapArrayInfo_EmitValue(currInfo->ArrayRangeContents[j], writer);
                    }
                    writer->WriteRecordEnd();
                }
                writer->WriteSequenceEnd();
                writer->WriteRecordEnd();
            }
            writer->AdjustIndent(-1);
            writer->WriteSequenceEnd(NSTokens::Separator::BigSpaceSeparator);
        }